

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Plan::EdgeMaybeReady(Plan *this,iterator want_e,string *err)

{
  Edge *this_00;
  bool bVar1;
  
  this_00 = *(Edge **)(want_e._M_node + 1);
  bVar1 = Edge::AllInputsReady(this_00);
  if (bVar1) {
    if (*(int *)&want_e._M_node[1]._M_parent == 0) {
      bVar1 = EdgeFinished(this,this_00,kEdgeSucceeded,err);
      if (!bVar1) {
        return false;
      }
    }
    else {
      ScheduleWork(this,want_e);
    }
  }
  return true;
}

Assistant:

bool Plan::EdgeMaybeReady(map<Edge*, Want>::iterator want_e, string* err) {
  Edge* edge = want_e->first;
  if (edge->AllInputsReady()) {
    if (want_e->second != kWantNothing) {
      ScheduleWork(want_e);
    } else {
      // We do not need to build this edge, but we might need to build one of
      // its dependents.
      if (!EdgeFinished(edge, kEdgeSucceeded, err))
        return false;
    }
  }
  return true;
}